

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

void M680X_reg_access(cs_insn *insn,uint16_t *regs_read,uint8_t *regs_read_count,
                     uint16_t *regs_write,uint8_t *regs_write_count)

{
  undefined1 in_CL;
  undefined7 in_register_00000009;
  byte *in_RDX;
  void *in_RSI;
  long in_RDI;
  byte *in_R8;
  
  if (*(long *)(in_RDI + 0xf0) == 0) {
    *in_RDX = 0;
    *in_R8 = 0;
  }
  else {
    *in_RDX = *(byte *)(*(long *)(in_RDI + 0xf0) + 0x20);
    *in_R8 = *(byte *)(*(long *)(in_RDI + 0xf0) + 0x4a);
    memcpy(in_RSI,*(void **)(in_RDI + 0xf0),(ulong)*in_RDX << 1);
    memcpy((void *)CONCAT71(in_register_00000009,in_CL),(void *)(*(long *)(in_RDI + 0xf0) + 0x22),
           (ulong)*in_R8 << 1);
  }
  return;
}

Assistant:

void M680X_reg_access(const cs_insn *insn,
	cs_regs regs_read, uint8_t *regs_read_count,
	cs_regs regs_write, uint8_t *regs_write_count)
{
	if (insn->detail == NULL) {
		*regs_read_count = 0;
		*regs_write_count = 0;
	}
	else {
		*regs_read_count = insn->detail->regs_read_count;
		*regs_write_count = insn->detail->regs_write_count;

		memcpy(regs_read, insn->detail->regs_read,
			*regs_read_count * sizeof(insn->detail->regs_read[0]));
		memcpy(regs_write, insn->detail->regs_write,
			*regs_write_count *
			sizeof(insn->detail->regs_write[0]));
	}
}